

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O1

void __thiscall
amrex::FaceLinear::interp_arr
          (FaceLinear *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_9,Geometry *param_10,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_11,int param_12,int param_13,RunOn runon)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  undefined8 *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  bool bVar32;
  double dVar33;
  Box bx;
  Array<IndexType,_3> types;
  GpuArray<amrex::Array4<double>,_3U> fine_arr;
  GpuArray<amrex::Array4<const_int>,_3U> mask_arr;
  GpuArray<amrex::Array4<const_double>,_3U> crse_arr;
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint auStack_33c [2];
  undefined8 uStack_334;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint auStack_31c [2];
  undefined8 uStack_314;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint auStack_2fc [2];
  undefined8 uStack_2f4;
  undefined8 auStack_29c [2];
  uint local_288;
  undefined8 uStack_284;
  undefined8 local_27c;
  undefined4 local_274;
  long local_270 [4];
  int local_250 [3];
  ulong uStack_244;
  int aiStack_23c [3];
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  int local_210;
  int local_20c;
  int local_208;
  long local_1f0;
  long local_1e8;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [8];
  int local_1d0;
  int local_1cc;
  int local_1c8;
  undefined8 auStack_1c4 [2];
  undefined4 uStack_1b4;
  long local_1b0 [4];
  int local_190 [3];
  ulong uStack_184;
  undefined4 auStack_17c [3];
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  int local_150;
  int local_14c;
  int local_148;
  long local_130;
  long local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  int local_110;
  int local_10c;
  int local_108;
  undefined8 auStack_104 [2];
  undefined4 uStack_f4;
  long local_f0 [4];
  int local_d0 [3];
  ulong uStack_c4;
  int aiStack_bc [3];
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  int local_90;
  int local_8c;
  int local_88;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_50;
  int local_4c;
  int local_48;
  
  uStack_284._4_4_ = 0;
  _local_288 = 0;
  lVar13 = 0;
  do {
    (&local_288)[lVar13] = (&local_288)[lVar13] | 1 << ((byte)lVar13 & 0x1f);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 0x2c;
  do {
    *(undefined8 *)((long)&local_10c + lVar13) = 0;
    *(undefined8 *)((long)auStack_104 + lVar13) = 0;
    *(undefined8 *)(local_120 + lVar13 + 4) = 0;
    *(undefined8 *)(local_118 + lVar13 + 4) = 0;
    *(undefined8 *)((long)auStack_104 + lVar13 + 8) = 0x100000001;
    *(undefined4 *)((long)&uStack_f4 + lVar13) = 1;
    *(undefined8 *)((long)local_f0 + lVar13) = 0;
    *(undefined8 *)((long)local_f0 + lVar13 + 8) = 0;
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0xec);
  lVar13 = 0x2c;
  do {
    *(undefined8 *)(&stack0xfffffffffffffd74 + lVar13) = 0;
    *(undefined8 *)((long)&uStack_284 + lVar13) = 0;
    *(undefined8 *)((long)auStack_29c + lVar13) = 0;
    *(undefined8 *)((long)auStack_29c + lVar13 + 8) = 0;
    *(undefined8 *)((long)&local_27c + lVar13) = 0x100000001;
    *(undefined4 *)((long)&local_274 + lVar13) = 1;
    *(undefined8 *)((long)local_270 + lVar13) = 0;
    *(undefined8 *)((long)local_270 + lVar13 + 8) = 0;
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0xec);
  lVar13 = 0x2c;
  do {
    *(undefined8 *)((long)&local_1cc + lVar13) = 0;
    *(undefined8 *)((long)auStack_1c4 + lVar13) = 0;
    *(undefined8 *)(local_1e0 + lVar13 + 4) = 0;
    *(undefined8 *)(local_1d8 + lVar13 + 4) = 0;
    *(undefined8 *)((long)auStack_1c4 + lVar13 + 8) = 0x100000001;
    *(undefined4 *)((long)&uStack_1b4 + lVar13) = 1;
    *(undefined8 *)((long)local_1b0 + lVar13) = 0;
    *(undefined8 *)((long)local_1b0 + lVar13 + 8) = 0;
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0xec);
  lVar13 = 0;
  do {
    lVar31 = *(long *)((long)crse->_M_elems + lVar13);
    iVar1 = *(int *)(lVar31 + 0x20);
    uVar4 = *(undefined8 *)(lVar31 + 0x18);
    lVar27 = (long)*(int *)(lVar31 + 0x28) + 1;
    iVar29 = *(int *)(lVar31 + 0x24);
    lVar30 = (long)*(int *)(lVar31 + 0x2c) + 1;
    lVar21 = ((long)iVar29 - (long)*(int *)(lVar31 + 0x18)) + 1;
    lVar28 = (lVar27 - *(int *)(lVar31 + 0x1c)) * lVar21;
    lVar19 = (lVar30 - iVar1) * lVar28;
    iVar2 = *(int *)(lVar31 + 0x34);
    local_f0[lVar13] = lVar19 * crse_comp * 8 + *(long *)(lVar31 + 0x10);
    local_f0[lVar13 + 1] = lVar21;
    local_f0[lVar13 + 2] = lVar28;
    local_f0[lVar13 + 3] = lVar19;
    *(undefined8 *)(local_d0 + lVar13 * 2) = uVar4;
    local_d0[lVar13 * 2 + 2] = iVar1;
    (&uStack_c4)[lVar13] = (ulong)(iVar29 + 1) | lVar27 << 0x20;
    aiStack_bc[lVar13 * 2] = (int)lVar30;
    aiStack_bc[lVar13 * 2 + 1] = iVar2 - crse_comp;
    lVar31 = *(long *)((long)fine->_M_elems + lVar13);
    iVar1 = *(int *)(lVar31 + 0x20);
    uVar4 = *(undefined8 *)(lVar31 + 0x18);
    lVar27 = (long)*(int *)(lVar31 + 0x28) + 1;
    iVar29 = *(int *)(lVar31 + 0x24);
    lVar30 = (long)*(int *)(lVar31 + 0x2c) + 1;
    lVar21 = ((long)iVar29 - (long)*(int *)(lVar31 + 0x18)) + 1;
    lVar28 = (lVar27 - *(int *)(lVar31 + 0x1c)) * lVar21;
    lVar19 = (lVar30 - iVar1) * lVar28;
    iVar2 = *(int *)(lVar31 + 0x34);
    local_270[lVar13] = lVar19 * fine_comp * 8 + *(long *)(lVar31 + 0x10);
    local_270[lVar13 + 1] = lVar21;
    local_270[lVar13 + 2] = lVar28;
    local_270[lVar13 + 3] = lVar19;
    *(undefined8 *)(local_250 + lVar13 * 2) = uVar4;
    local_250[lVar13 * 2 + 2] = iVar1;
    (&uStack_244)[lVar13] = (ulong)(iVar29 + 1) | lVar27 << 0x20;
    aiStack_23c[lVar13 * 2] = (int)lVar30;
    aiStack_23c[lVar13 * 2 + 1] = iVar2 - fine_comp;
    lVar31 = *(long *)((long)solve_mask->_M_elems + lVar13);
    if (lVar31 != 0) {
      uVar3 = *(undefined4 *)(lVar31 + 0x34);
      iVar1 = *(int *)(lVar31 + 0x20);
      uVar4 = *(undefined8 *)(lVar31 + 0x18);
      lVar27 = (long)*(int *)(lVar31 + 0x28) + 1;
      iVar29 = *(int *)(lVar31 + 0x24);
      lVar19 = (long)*(int *)(lVar31 + 0x2c) + 1;
      lVar21 = ((long)iVar29 - (long)*(int *)(lVar31 + 0x18)) + 1;
      lVar28 = (lVar27 - *(int *)(lVar31 + 0x1c)) * lVar21;
      local_1b0[lVar13] = *(long *)(lVar31 + 0x10);
      local_1b0[lVar13 + 1] = lVar21;
      local_1b0[lVar13 + 2] = lVar28;
      local_1b0[lVar13 + 3] = (lVar19 - iVar1) * lVar28;
      *(undefined8 *)(local_190 + lVar13 * 2) = uVar4;
      local_190[lVar13 * 2 + 2] = iVar1;
      (&uStack_184)[lVar13] = (long)iVar29 + 1U & 0xffffffff | lVar27 << 0x20;
      auStack_17c[lVar13 * 2] = (int)lVar19;
      auStack_17c[lVar13 * 2 + 1] = uVar3;
    }
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x18);
  uVar4 = *(undefined8 *)(fine_region->smallend).vect;
  uVar5 = *(undefined8 *)((fine_region->smallend).vect + 2);
  auStack_2fc[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uStack_2f4 = *(undefined8 *)((fine_region->bigend).vect + 2);
  uStack_300 = (uint)uVar5;
  auStack_2fc[0] = (uint)((ulong)uVar5 >> 0x20);
  lVar13 = 0;
  do {
    uVar8 = 1 << ((byte)lVar13 & 0x1f);
    uVar11 = (uint)lVar13;
    auStack_2fc[lVar13] =
         (auStack_2fc[lVar13] + (uint)((local_288 >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((uStack_2f4._4_4_ >> (uVar11 & 0x1f) & 1) != 0);
    if ((local_288 >> (uVar11 & 0x1f) & 1) == 0) {
      uVar8 = ~uVar8 & uStack_2f4._4_4_;
    }
    else {
      uVar8 = uVar8 | uStack_2f4._4_4_;
    }
    uStack_2f4 = CONCAT44(uVar8,(uint)uStack_2f4);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  uVar5 = *(undefined8 *)(fine_region->smallend).vect;
  uVar6 = *(undefined8 *)((fine_region->smallend).vect + 2);
  auStack_31c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uStack_314 = *(undefined8 *)((fine_region->bigend).vect + 2);
  uStack_320 = (uint)uVar6;
  auStack_31c[0] = (uint)((ulong)uVar6 >> 0x20);
  lVar13 = 0;
  do {
    uVar8 = 1 << ((byte)lVar13 & 0x1f);
    uVar11 = (uint)lVar13;
    auStack_31c[lVar13] =
         (auStack_31c[lVar13] + (uint)(((uint)uStack_284 >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((uStack_314._4_4_ >> (uVar11 & 0x1f) & 1) != 0);
    if (((uint)uStack_284 >> (uVar11 & 0x1f) & 1) == 0) {
      uVar8 = ~uVar8 & uStack_314._4_4_;
    }
    else {
      uVar8 = uVar8 | uStack_314._4_4_;
    }
    uStack_314 = CONCAT44(uVar8,(uint)uStack_314);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  uVar6 = *(undefined8 *)(fine_region->smallend).vect;
  uVar7 = *(undefined8 *)((fine_region->smallend).vect + 2);
  auStack_33c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uStack_334 = *(undefined8 *)((fine_region->bigend).vect + 2);
  uStack_340 = (uint)uVar7;
  auStack_33c[0] = (uint)((ulong)uVar7 >> 0x20);
  lVar13 = 0;
  do {
    uVar8 = 1 << ((byte)lVar13 & 0x1f);
    uVar11 = (uint)lVar13;
    auStack_33c[lVar13] =
         (auStack_33c[lVar13] + (uint)((uStack_284._4_4_ >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((uStack_334._4_4_ >> (uVar11 & 0x1f) & 1) != 0);
    if ((uStack_284._4_4_ >> (uVar11 & 0x1f) & 1) == 0) {
      uVar8 = ~uVar8 & uStack_334._4_4_;
    }
    else {
      uVar8 = uVar8 | uStack_334._4_4_;
    }
    uStack_334 = CONCAT44(uVar8,(uint)uStack_334);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  if ((int)uStack_300 <= (int)(uint)uStack_2f4) {
    local_308 = (uint)uVar4;
    uStack_304 = (uint)((ulong)uVar4 >> 0x20);
    do {
      if ((int)uStack_304 <= (int)auStack_2fc[1]) {
        uVar11 = uStack_300 + 1;
        uVar8 = -uVar11;
        if (0 < (int)uVar11) {
          uVar8 = uVar11;
        }
        uVar11 = ~(uVar8 >> 2);
        if (-1 < (int)uStack_300) {
          uVar11 = uStack_300 >> 2;
        }
        uVar17 = uStack_304;
        uVar16 = ~(uVar8 >> 1);
        if (-1 < (int)uStack_300) {
          uVar16 = uStack_300 >> 1;
        }
        do {
          if ((int)local_308 <= (int)auStack_2fc[0]) {
            iVar1 = ratio->vect[0];
            uVar12 = uVar17 + 1;
            uVar15 = -uVar12;
            if (0 < (int)uVar12) {
              uVar15 = uVar12;
            }
            uVar12 = ~(uVar15 >> 2);
            if (-1 < (int)uVar17) {
              uVar12 = uVar17 >> 2;
            }
            uVar10 = local_308;
            uVar22 = ~(uVar15 >> 1);
            if (-1 < (int)uVar17) {
              uVar22 = uVar17 >> 1;
            }
            do {
              if (0 < ncomp) {
                uVar23 = uVar10 + 1;
                uVar24 = -uVar23;
                if (0 < (int)uVar23) {
                  uVar24 = uVar23;
                }
                iVar29 = ratio->vect[1];
                iVar2 = ratio->vect[2];
                uVar23 = ~(uVar24 >> 2);
                if (-1 < (int)uVar10) {
                  uVar23 = uVar10 >> 2;
                }
                uVar26 = ~(uVar24 >> 1);
                if (-1 < (int)uVar10) {
                  uVar26 = uVar10 >> 1;
                }
                puVar14 = (undefined8 *)
                          (((long)(int)uVar17 - (long)local_250[1]) * local_270[1] * 8 +
                           ((long)(int)uStack_300 - (long)local_250[2]) * local_270[2] * 8 +
                           (long)(int)uVar10 * 8 + (long)local_250[0] * -8 + local_270[0]);
                lVar13 = local_f0[0] + (long)local_d0[0] * -8;
                uVar25 = (ulong)(uint)ncomp;
                lVar31 = local_1b0[0] + (long)local_190[0] * -4;
                do {
                  uVar18 = uVar10;
                  if (((iVar1 != 1) && (uVar18 = uVar23, iVar1 != 4)) &&
                     (uVar18 = uVar26, iVar1 != 2)) {
                    if ((int)uVar10 < 0) {
                      uVar18 = ~((int)uVar24 / iVar1);
                    }
                    else {
                      uVar18 = (int)uVar10 / iVar1;
                    }
                  }
                  if (uVar18 * iVar1 == uVar10) {
                    uVar20 = uVar17;
                    if (((iVar29 != 1) && (uVar20 = uVar12, iVar29 != 4)) &&
                       (uVar20 = uVar22, iVar29 != 2)) {
                      if ((int)uVar17 < 0) {
                        uVar20 = ~((int)uVar15 / iVar29);
                      }
                      else {
                        uVar20 = (int)uVar17 / iVar29;
                      }
                    }
                    uVar9 = uStack_300;
                    if (((iVar2 != 1) && (uVar9 = uVar11, iVar2 != 4)) &&
                       (uVar9 = uVar16, iVar2 != 2)) {
                      if ((int)uStack_300 < 0) {
                        uVar9 = ~((int)uVar8 / iVar2);
                      }
                      else {
                        uVar9 = (int)uStack_300 / iVar2;
                      }
                    }
                    if ((local_1b0[0] == 0) ||
                       (*(int *)(lVar31 + ((long)(int)uVar9 - (long)local_190[2]) * local_1b0[2] * 4
                                          + ((long)(int)uVar20 - (long)local_190[1]) *
                                            local_1b0[1] * 4 + (long)(int)uVar18 * 4) != 0)) {
                      *puVar14 = *(undefined8 *)
                                  (lVar13 + ((long)(int)uVar9 - (long)local_d0[2]) * local_f0[2] * 8
                                            + ((long)(int)uVar20 - (long)local_d0[1]) *
                                              local_f0[1] * 8 + (long)(int)uVar18 * 8);
                    }
                  }
                  lVar31 = lVar31 + local_1b0[3] * 4;
                  puVar14 = puVar14 + local_270[3];
                  lVar13 = lVar13 + local_f0[3] * 8;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              bVar32 = uVar10 != auStack_2fc[0];
              uVar10 = uVar10 + 1;
            } while (bVar32);
          }
          bVar32 = uVar17 != auStack_2fc[1];
          uVar17 = uVar17 + 1;
        } while (bVar32);
      }
      bVar32 = uStack_300 != (uint)uStack_2f4;
      uStack_300 = uStack_300 + 1;
    } while (bVar32);
  }
  if ((int)uStack_320 <= (int)(uint)uStack_314) {
    local_328 = (uint)uVar5;
    uStack_324 = (uint)((ulong)uVar5 >> 0x20);
    do {
      if ((int)uStack_324 <= (int)auStack_31c[1]) {
        uVar11 = uStack_320 + 1;
        uVar8 = -uVar11;
        if (0 < (int)uVar11) {
          uVar8 = uVar11;
        }
        uVar11 = ~(uVar8 >> 2);
        if (-1 < (int)uStack_320) {
          uVar11 = uStack_320 >> 2;
        }
        uVar17 = uStack_324;
        uVar16 = ~(uVar8 >> 1);
        if (-1 < (int)uStack_320) {
          uVar16 = uStack_320 >> 1;
        }
        do {
          if ((int)local_328 <= (int)auStack_31c[0]) {
            iVar1 = ratio->vect[1];
            uVar12 = uVar17 + 1;
            uVar15 = -uVar12;
            if (0 < (int)uVar12) {
              uVar15 = uVar12;
            }
            uVar12 = ~(uVar15 >> 2);
            if (-1 < (int)uVar17) {
              uVar12 = uVar17 >> 2;
            }
            uVar10 = local_328;
            uVar22 = ~(uVar15 >> 1);
            if (-1 < (int)uVar17) {
              uVar22 = uVar17 >> 1;
            }
            do {
              if (0 < ncomp) {
                iVar29 = ratio->vect[0];
                iVar2 = ratio->vect[2];
                uVar23 = uVar10 + 1;
                uVar24 = -uVar23;
                if (0 < (int)uVar23) {
                  uVar24 = uVar23;
                }
                uVar23 = ~(uVar24 >> 2);
                if (-1 < (int)uVar10) {
                  uVar23 = uVar10 >> 2;
                }
                uVar26 = ~(uVar24 >> 1);
                if (-1 < (int)uVar10) {
                  uVar26 = uVar10 >> 1;
                }
                puVar14 = (undefined8 *)
                          (((long)(int)uVar17 - (long)local_20c) * local_228 * 8 +
                           ((long)(int)uStack_320 - (long)local_208) * local_220 * 8 +
                           (long)(int)uVar10 * 8 + (long)local_210 * -8 + local_230);
                lVar13 = local_b0 + (long)local_90 * -8;
                lVar31 = local_170 + (long)local_150 * -4;
                uVar25 = (ulong)(uint)ncomp;
                do {
                  uVar18 = uVar17;
                  if (((iVar1 != 1) && (uVar18 = uVar12, iVar1 != 4)) &&
                     (uVar18 = uVar22, iVar1 != 2)) {
                    if ((int)uVar17 < 0) {
                      uVar18 = ~((int)uVar15 / iVar1);
                    }
                    else {
                      uVar18 = (int)uVar17 / iVar1;
                    }
                  }
                  if (uVar18 * iVar1 == uVar17) {
                    uVar20 = uVar10;
                    if (((iVar29 != 1) && (uVar20 = uVar23, iVar29 != 4)) &&
                       (uVar20 = uVar26, iVar29 != 2)) {
                      if ((int)uVar10 < 0) {
                        uVar20 = ~((int)uVar24 / iVar29);
                      }
                      else {
                        uVar20 = (int)uVar10 / iVar29;
                      }
                    }
                    uVar9 = uStack_320;
                    if (((iVar2 != 1) && (uVar9 = uVar11, iVar2 != 4)) &&
                       (uVar9 = uVar16, iVar2 != 2)) {
                      if ((int)uStack_320 < 0) {
                        uVar9 = ~((int)uVar8 / iVar2);
                      }
                      else {
                        uVar9 = (int)uStack_320 / iVar2;
                      }
                    }
                    if ((local_170 == 0) ||
                       (*(int *)(lVar31 + ((long)(int)uVar9 - (long)local_148) * local_160 * 4 +
                                          ((long)(int)uVar18 - (long)local_14c) * local_168 * 4 +
                                          (long)(int)uVar20 * 4) != 0)) {
                      *puVar14 = *(undefined8 *)
                                  (lVar13 + ((long)(int)uVar9 - (long)local_88) * local_a0 * 8 +
                                            ((long)(int)uVar18 - (long)local_8c) * local_a8 * 8 +
                                            (long)(int)uVar20 * 8);
                    }
                  }
                  lVar31 = lVar31 + local_158 * 4;
                  puVar14 = puVar14 + local_218;
                  lVar13 = lVar13 + local_98 * 8;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              bVar32 = uVar10 != auStack_31c[0];
              uVar10 = uVar10 + 1;
            } while (bVar32);
          }
          bVar32 = uVar17 != auStack_31c[1];
          uVar17 = uVar17 + 1;
        } while (bVar32);
      }
      bVar32 = uStack_320 != (uint)uStack_314;
      uStack_320 = uStack_320 + 1;
    } while (bVar32);
  }
  if ((int)uStack_340 <= (int)(uint)uStack_334) {
    local_348 = (uint)uVar6;
    uStack_344 = (uint)((ulong)uVar6 >> 0x20);
    do {
      if ((int)uStack_344 <= (int)auStack_33c[1]) {
        uVar11 = uStack_340 + 1;
        uVar8 = -uVar11;
        if (0 < (int)uVar11) {
          uVar8 = uVar11;
        }
        uVar11 = ~(uVar8 >> 2);
        if (-1 < (int)uStack_340) {
          uVar11 = uStack_340 >> 2;
        }
        uVar17 = uStack_344;
        uVar16 = ~(uVar8 >> 1);
        if (-1 < (int)uStack_340) {
          uVar16 = uStack_340 >> 1;
        }
        do {
          if ((int)local_348 <= (int)auStack_33c[0]) {
            iVar1 = ratio->vect[2];
            uVar12 = uVar17 + 1;
            uVar15 = -uVar12;
            if (0 < (int)uVar12) {
              uVar15 = uVar12;
            }
            uVar12 = ~(uVar15 >> 2);
            if (-1 < (int)uVar17) {
              uVar12 = uVar17 >> 2;
            }
            uVar10 = local_348;
            uVar22 = ~(uVar15 >> 1);
            if (-1 < (int)uVar17) {
              uVar22 = uVar17 >> 1;
            }
            do {
              if (0 < ncomp) {
                iVar29 = ratio->vect[0];
                iVar2 = ratio->vect[1];
                uVar23 = uVar10 + 1;
                uVar24 = -uVar23;
                if (0 < (int)uVar23) {
                  uVar24 = uVar23;
                }
                uVar23 = ~(uVar24 >> 2);
                if (-1 < (int)uVar10) {
                  uVar23 = uVar10 >> 2;
                }
                uVar26 = ~(uVar24 >> 1);
                if (-1 < (int)uVar10) {
                  uVar26 = uVar10 >> 1;
                }
                puVar14 = (undefined8 *)
                          (((long)(int)uVar17 - (long)local_1cc) * local_1e8 * 8 +
                           ((long)(int)uStack_340 - (long)local_1c8) * (long)local_1e0 * 8 +
                           (long)(int)uVar10 * 8 + (long)local_1d0 * -8 + local_1f0);
                uVar25 = (ulong)(uint)ncomp;
                lVar13 = local_130 + (long)local_110 * -4;
                lVar31 = local_70 + (long)local_50 * -8;
                do {
                  uVar18 = uStack_340;
                  if (((iVar1 != 1) && (uVar18 = uVar11, iVar1 != 4)) &&
                     (uVar18 = uVar16, iVar1 != 2)) {
                    if ((int)uStack_340 < 0) {
                      uVar18 = ~((int)uVar8 / iVar1);
                    }
                    else {
                      uVar18 = (int)uStack_340 / iVar1;
                    }
                  }
                  if (uVar18 * iVar1 == uStack_340) {
                    uVar20 = uVar10;
                    if (((iVar29 != 1) && (uVar20 = uVar23, iVar29 != 4)) &&
                       (uVar20 = uVar26, iVar29 != 2)) {
                      if ((int)uVar10 < 0) {
                        uVar20 = ~((int)uVar24 / iVar29);
                      }
                      else {
                        uVar20 = (int)uVar10 / iVar29;
                      }
                    }
                    uVar9 = uVar17;
                    if (((iVar2 != 1) && (uVar9 = uVar12, iVar2 != 4)) &&
                       (uVar9 = uVar22, iVar2 != 2)) {
                      if ((int)uVar17 < 0) {
                        uVar9 = ~((int)uVar15 / iVar2);
                      }
                      else {
                        uVar9 = (int)uVar17 / iVar2;
                      }
                    }
                    if ((local_130 == 0) ||
                       (*(int *)(lVar13 + ((long)(int)uVar18 - (long)local_108) *
                                          (long)local_120 * 4 +
                                          ((long)(int)uVar9 - (long)local_10c) * local_128 * 4 +
                                          (long)(int)uVar20 * 4) != 0)) {
                      *puVar14 = *(undefined8 *)
                                  (lVar31 + ((long)(int)uVar18 - (long)local_48) * local_60 * 8 +
                                            ((long)(int)uVar9 - (long)local_4c) * local_68 * 8 +
                                            (long)(int)uVar20 * 8);
                    }
                  }
                  lVar13 = lVar13 + (long)local_118 * 4;
                  puVar14 = puVar14 + (long)local_1d8;
                  lVar31 = lVar31 + local_58 * 8;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              bVar32 = uVar10 != auStack_33c[0];
              uVar10 = uVar10 + 1;
            } while (bVar32);
          }
          bVar32 = uVar17 != auStack_33c[1];
          uVar17 = uVar17 + 1;
        } while (bVar32);
      }
      bVar32 = uStack_340 != (uint)uStack_334;
      uStack_340 = uStack_340 + 1;
    } while (bVar32);
  }
  uVar4 = *(undefined8 *)(fine_region->smallend).vect;
  uVar5 = *(undefined8 *)((fine_region->smallend).vect + 2);
  auStack_2fc[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uStack_2f4 = *(undefined8 *)((fine_region->bigend).vect + 2);
  uStack_300 = (uint)uVar5;
  auStack_2fc[0] = (uint)((ulong)uVar5 >> 0x20);
  lVar13 = 0;
  do {
    uVar8 = 1 << ((byte)lVar13 & 0x1f);
    uVar11 = (uint)lVar13;
    auStack_2fc[lVar13] =
         (auStack_2fc[lVar13] + (uint)((local_288 >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((uStack_2f4._4_4_ >> (uVar11 & 0x1f) & 1) != 0);
    if ((local_288 >> (uVar11 & 0x1f) & 1) == 0) {
      uVar8 = ~uVar8 & uStack_2f4._4_4_;
    }
    else {
      uVar8 = uVar8 | uStack_2f4._4_4_;
    }
    uStack_2f4 = CONCAT44(uVar8,(uint)uStack_2f4);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  uVar5 = *(undefined8 *)(fine_region->smallend).vect;
  uVar6 = *(undefined8 *)((fine_region->smallend).vect + 2);
  auStack_31c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uStack_314 = *(undefined8 *)((fine_region->bigend).vect + 2);
  uStack_320 = (uint)uVar6;
  auStack_31c[0] = (uint)((ulong)uVar6 >> 0x20);
  lVar13 = 0;
  do {
    uVar8 = 1 << ((byte)lVar13 & 0x1f);
    uVar11 = (uint)lVar13;
    auStack_31c[lVar13] =
         (auStack_31c[lVar13] + (uint)(((uint)uStack_284 >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((uStack_314._4_4_ >> (uVar11 & 0x1f) & 1) != 0);
    if (((uint)uStack_284 >> (uVar11 & 0x1f) & 1) == 0) {
      uVar8 = ~uVar8 & uStack_314._4_4_;
    }
    else {
      uVar8 = uVar8 | uStack_314._4_4_;
    }
    uStack_314 = CONCAT44(uVar8,(uint)uStack_314);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  uVar6 = *(undefined8 *)(fine_region->smallend).vect;
  uVar7 = *(undefined8 *)((fine_region->smallend).vect + 2);
  auStack_33c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uStack_334 = *(undefined8 *)((fine_region->bigend).vect + 2);
  uStack_340 = (uint)uVar7;
  auStack_33c[0] = (uint)((ulong)uVar7 >> 0x20);
  lVar13 = 0;
  do {
    uVar8 = 1 << ((byte)lVar13 & 0x1f);
    uVar11 = (uint)lVar13;
    auStack_33c[lVar13] =
         (auStack_33c[lVar13] + (uint)((uStack_284._4_4_ >> (uVar11 & 0x1f) & 1) != 0)) -
         (uint)((uStack_334._4_4_ >> (uVar11 & 0x1f) & 1) != 0);
    if ((uStack_284._4_4_ >> (uVar11 & 0x1f) & 1) == 0) {
      uVar8 = ~uVar8 & uStack_334._4_4_;
    }
    else {
      uVar8 = uVar8 | uStack_334._4_4_;
    }
    uStack_334 = CONCAT44(uVar8,(uint)uStack_334);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  if ((int)uStack_300 <= (int)(uint)uStack_2f4) {
    uVar8 = (uint)uVar4;
    uStack_304 = (uint)((ulong)uVar4 >> 0x20);
    do {
      if ((int)uStack_304 <= (int)auStack_2fc[1]) {
        uVar11 = uStack_304;
        do {
          if ((int)uVar8 <= (int)auStack_2fc[0]) {
            iVar1 = ratio->vect[0];
            uVar17 = uVar8;
            do {
              if (0 < ncomp) {
                uVar15 = uVar17 + 1;
                uVar16 = -uVar15;
                if (0 < (int)uVar15) {
                  uVar16 = uVar15;
                }
                uVar15 = ~(uVar16 >> 1);
                uVar12 = ~(uVar16 >> 2);
                if (-1 < (int)uVar17) {
                  uVar15 = uVar17 >> 1;
                  uVar12 = uVar17 >> 2;
                }
                lVar13 = ((long)(int)uVar11 - (long)local_250[1]) * local_270[1] * 8 +
                         ((long)(int)uStack_300 - (long)local_250[2]) * local_270[2] * 8 +
                         (long)local_250[0] * -8 + local_270[0];
                uVar25 = (ulong)(uint)ncomp;
                do {
                  uVar10 = uVar17;
                  if (((iVar1 != 1) && (uVar10 = uVar12, iVar1 != 4)) &&
                     (uVar10 = uVar15, iVar1 != 2)) {
                    if ((int)uVar17 < 0) {
                      uVar10 = ~((int)uVar16 / iVar1);
                    }
                    else {
                      uVar10 = (int)uVar17 / iVar1;
                    }
                  }
                  iVar29 = uVar17 - uVar10 * iVar1;
                  if (iVar29 != 0) {
                    dVar33 = (double)iVar29 * (1.0 / (double)iVar1);
                    *(double *)(lVar13 + (long)(int)uVar17 * 8) =
                         (1.0 - dVar33) * *(double *)(lVar13 + (long)(int)(uVar10 * iVar1) * 8) +
                         dVar33 * *(double *)(lVar13 + (long)(int)((uVar10 + 1) * iVar1) * 8);
                  }
                  lVar13 = lVar13 + local_270[3] * 8;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              bVar32 = uVar17 != auStack_2fc[0];
              uVar17 = uVar17 + 1;
            } while (bVar32);
          }
          bVar32 = uVar11 != auStack_2fc[1];
          uVar11 = uVar11 + 1;
        } while (bVar32);
      }
      bVar32 = uStack_300 != (uint)uStack_2f4;
      uStack_300 = uStack_300 + 1;
    } while (bVar32);
  }
  if ((int)uStack_320 <= (int)(uint)uStack_314) {
    uVar8 = (uint)uVar5;
    uStack_324 = (uint)((ulong)uVar5 >> 0x20);
    do {
      if ((int)uStack_324 <= (int)auStack_31c[1]) {
        uVar11 = uStack_324;
        do {
          if ((int)uVar8 <= (int)auStack_31c[0]) {
            iVar1 = ratio->vect[1];
            uVar16 = uVar11 + 1;
            uVar17 = -uVar16;
            if (0 < (int)uVar16) {
              uVar17 = uVar16;
            }
            uVar16 = ~(uVar17 >> 2);
            if (-1 < (int)uVar11) {
              uVar16 = uVar11 >> 2;
            }
            uVar12 = uVar8;
            uVar15 = ~(uVar17 >> 1);
            if (-1 < (int)uVar11) {
              uVar15 = uVar11 >> 1;
            }
            do {
              if (0 < ncomp) {
                lVar13 = local_228 * 8;
                lVar31 = (long)(int)uVar12 * 8 +
                         ((long)(int)uStack_320 - (long)local_208) * local_220 * 8 +
                         (long)local_210 * -8 + local_230;
                uVar25 = (ulong)(uint)ncomp;
                do {
                  uVar10 = uVar11;
                  if (((iVar1 != 1) && (uVar10 = uVar16, iVar1 != 4)) &&
                     (uVar10 = uVar15, iVar1 != 2)) {
                    if ((int)uVar11 < 0) {
                      uVar10 = ~((int)uVar17 / iVar1);
                    }
                    else {
                      uVar10 = (int)uVar11 / iVar1;
                    }
                  }
                  iVar29 = uVar11 - uVar10 * iVar1;
                  if (iVar29 != 0) {
                    dVar33 = (double)iVar29 * (1.0 / (double)iVar1);
                    *(double *)(lVar31 + ((long)(int)uVar11 - (long)local_20c) * lVar13) =
                         (1.0 - dVar33) *
                         *(double *)(lVar31 + (int)(uVar10 * iVar1 - local_20c) * lVar13) +
                         dVar33 * *(double *)
                                   (lVar31 + (int)((uVar10 + 1) * iVar1 - local_20c) * lVar13);
                  }
                  lVar31 = lVar31 + local_218 * 8;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              bVar32 = uVar12 != auStack_31c[0];
              uVar12 = uVar12 + 1;
            } while (bVar32);
          }
          bVar32 = uVar11 != auStack_31c[1];
          uVar11 = uVar11 + 1;
        } while (bVar32);
      }
      bVar32 = uStack_320 != (uint)uStack_314;
      uStack_320 = uStack_320 + 1;
    } while (bVar32);
  }
  if ((int)uStack_340 <= (int)(uint)uStack_334) {
    uVar8 = (uint)uVar6;
    uStack_344 = (uint)((ulong)uVar6 >> 0x20);
    do {
      if ((int)uStack_344 <= (int)auStack_33c[1]) {
        uVar17 = uStack_340 + 1;
        uVar11 = -uVar17;
        if (0 < (int)uVar17) {
          uVar11 = uVar17;
        }
        uVar17 = ~(uVar11 >> 2);
        if (-1 < (int)uStack_340) {
          uVar17 = uStack_340 >> 2;
        }
        uVar15 = uStack_344;
        uVar16 = ~(uVar11 >> 1);
        if (-1 < (int)uStack_340) {
          uVar16 = uStack_340 >> 1;
        }
        do {
          if ((int)uVar8 <= (int)auStack_33c[0]) {
            iVar1 = ratio->vect[2];
            uVar12 = uVar8;
            do {
              if (0 < ncomp) {
                lVar31 = (long)local_1e0 * 8;
                lVar13 = (long)(int)uVar12 * 8 +
                         ((long)(int)uVar15 - (long)local_1cc) * local_1e8 * 8 +
                         (long)local_1d0 * -8 + local_1f0;
                uVar25 = (ulong)(uint)ncomp;
                do {
                  uVar10 = uStack_340;
                  if (((iVar1 != 1) && (uVar10 = uVar17, iVar1 != 4)) &&
                     (uVar10 = uVar16, iVar1 != 2)) {
                    if ((int)uStack_340 < 0) {
                      uVar10 = ~((int)uVar11 / iVar1);
                    }
                    else {
                      uVar10 = (int)uStack_340 / iVar1;
                    }
                  }
                  iVar29 = uStack_340 - uVar10 * iVar1;
                  if (iVar29 != 0) {
                    dVar33 = (double)iVar29 * (1.0 / (double)iVar1);
                    *(double *)(lVar13 + ((long)(int)uStack_340 - (long)local_1c8) * lVar31) =
                         (1.0 - dVar33) *
                         *(double *)(lVar13 + (int)(uVar10 * iVar1 - local_1c8) * lVar31) +
                         dVar33 * *(double *)
                                   (lVar13 + (int)((uVar10 + 1) * iVar1 - local_1c8) * lVar31);
                  }
                  lVar13 = lVar13 + (long)local_1d8 * 8;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
              }
              bVar32 = uVar12 != auStack_33c[0];
              uVar12 = uVar12 + 1;
            } while (bVar32);
          }
          bVar32 = uVar15 != auStack_33c[1];
          uVar15 = uVar15 + 1;
        } while (bVar32);
      }
      bVar32 = uStack_340 != (uint)uStack_334;
      uStack_340 = uStack_340 + 1;
    } while (bVar32);
  }
  return;
}

Assistant:

void FaceLinear::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                             const int         crse_comp,
                             Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                             const int         fine_comp,
                             const int         ncomp,
                             const Box&        fine_region,
                             const IntVect&    ratio,
                             Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                             const Geometry&   /*crse_geom*/,
                             const Geometry&   /*fine_geom*/,
                             Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                             const int         /*actual_comp*/,
                             const int         /*actual_state*/,
                             const RunOn       runon)
{
    BL_PROFILE("FaceLinear::interp_arr()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crse_arr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> fine_arr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> mask_arr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crse_arr[d] = crse[d]->const_array(crse_comp);
        fine_arr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { mask_arr[d] = solve_mask[d]->const_array(0); }
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_x(i,j,k,n,fine_arr[0],crse_arr[0],mask_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_y(i,j,k,n,fine_arr[1],crse_arr[1],mask_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_z(i,j,k,n,fine_arr[2],crse_arr[2],mask_arr[2],ratio);
                      }
                  });
              });

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_x(i,j,k,n,fine_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_y(i,j,k,n,fine_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_z(i,j,k,n,fine_arr[2],ratio);
                      }
                  });
              });
}